

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O3

vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
obj::load_from_stream<float>
          (vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
           *__return_storage_ptr__,istream *is)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  _Storage<int,_true> _Var6;
  long *plVar7;
  ulong uVar8;
  _Optional_base<int,_true,_true> _Var9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  char *__nptr;
  Vec<float,_3UL> *pVVar16;
  float fVar17;
  char *ptr;
  float y;
  float z;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> vertices;
  float x;
  char line [1024];
  char *local_498;
  vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *local_490;
  Vec<float,_3UL> local_488;
  float local_47c;
  void *local_478;
  long lStack_470;
  long local_468;
  Vec<float,_3UL> local_458;
  Vec<float,_3UL> local_44c;
  char local_438 [1032];
  
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_468 = 0;
  local_478 = (void *)0x0;
  lStack_470 = 0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_490 = (vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)
              __return_storage_ptr__;
  do {
    do {
      std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
      plVar7 = (long *)std::istream::getline((char *)is,(long)local_438,'\0');
      __nptr = local_438;
      if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
        if (local_478 != (void *)0x0) {
          operator_delete(local_478,local_468 - (long)local_478);
        }
        return (vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *)
               local_490;
      }
      do {
        pcVar15 = __nptr;
        cVar12 = *pcVar15;
        iVar5 = isspace((int)cVar12);
        __nptr = pcVar15 + 1;
      } while (iVar5 != 0);
      local_498 = pcVar15;
    } while ((cVar12 == '\0') || (cVar12 == '#'));
    uVar8 = 0xffffffffffffffff;
    lVar4 = 1;
    do {
      lVar14 = lVar4;
      pcVar2 = __nptr + uVar8;
      uVar8 = uVar8 + 1;
      lVar4 = lVar14 + 1;
    } while (*pcVar2 != '\0');
    if (1 < uVar8) {
      do {
        uVar13 = (int)lVar14 - 2;
        iVar5 = isspace((int)pcVar15[uVar13]);
        if (iVar5 == 0) break;
        lVar14 = lVar14 + -1;
        pcVar15[uVar13] = '\0';
      } while (2 < lVar14);
      cVar12 = *pcVar15;
    }
    if (cVar12 == 'f') {
      iVar5 = isspace((int)*__nptr);
      if (iVar5 != 0) {
        local_498 = pcVar15 + 2;
        _Var9._M_payload.super__Optional_payload_base<int> =
             (_Optional_payload<int,_true,_true,_true>)read_index(&local_498);
        if (((ulong)_Var9._M_payload.super__Optional_payload_base<int> & 0x100000000) != 0) {
          pVVar16 = &local_458;
          uVar8 = 0;
          do {
            _Var6._M_value = _Var9._M_payload.super__Optional_payload_base<int>._M_payload;
            if (_Var6._M_value < 0) {
              uVar11 = (lStack_470 - (long)local_478 >> 2) * -0x5555555555555555;
              uVar10 = (long)_Var6._M_value + uVar11;
            }
            else {
              uVar10 = (ulong)(_Var6._M_value + -1);
              uVar11 = (lStack_470 - (long)local_478 >> 2) * -0x5555555555555555;
            }
            if (uVar11 <= uVar10) {
              __assert_fail("j < vertices.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/test/load_obj.cpp"
                            ,0x50,
                            "std::vector<Tri<T, 3>> obj::load_from_stream(std::istream &) [T = float]"
                           );
            }
            local_488.values[2] = *(float *)((long)local_478 + uVar10 * 0xc + 8);
            local_488.values._0_8_ = *(undefined8 *)((long)local_478 + uVar10 * 0xc);
            if (uVar8 < 2) {
              puVar1 = (undefined8 *)((long)local_478 + uVar10 * 0xc);
              uVar3 = *puVar1;
              pVVar16->values[2] = *(float *)(puVar1 + 1);
              *(undefined8 *)pVVar16->values = uVar3;
            }
            else {
              std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
              emplace_back<bvh::v2::Vec<float,3ul>&,bvh::v2::Vec<float,3ul>&,bvh::v2::Vec<float,3ul>&>
                        (local_490,&local_458,&local_44c,&local_488);
              local_44c.values[2] = local_488.values[2];
              local_44c.values[0] = local_488.values[0];
              local_44c.values[1] = local_488.values[1];
            }
            uVar8 = uVar8 + 1;
            _Var9._M_payload.super__Optional_payload_base<int> =
                 (_Optional_payload<int,_true,_true,_true>)read_index(&local_498);
            pVVar16 = pVVar16 + 1;
          } while (((ulong)_Var9._M_payload.super__Optional_payload_base<int> & 0x100000000) != 0);
        }
      }
    }
    else if ((cVar12 == 'v') && (iVar5 = isspace((int)*__nptr), iVar5 != 0)) {
      local_458.values[0] = strtof(__nptr,&local_498);
      fVar17 = strtof(local_498,&local_498);
      local_488.values[0] = fVar17;
      local_47c = strtof(local_498,&local_498);
      std::vector<bvh::v2::Vec<float,3ul>,std::allocator<bvh::v2::Vec<float,3ul>>>::
      emplace_back<float&,float&,float&>
                ((vector<bvh::v2::Vec<float,3ul>,std::allocator<bvh::v2::Vec<float,3ul>>> *)
                 &local_478,local_458.values,local_488.values,&local_47c);
    }
  } while( true );
}

Assistant:

inline std::vector<Tri<T, 3>> load_from_stream(std::istream& is) {
    static constexpr size_t max_line = 1024;
    char line[max_line];

    std::vector<Vec<T, 3>> vertices;
    std::vector<Tri<T, 3>> triangles;

    while (is.getline(line, max_line)) {
        char* ptr = strip_spaces(line);
        if (*ptr == '\0' || *ptr == '#')
            continue;
        remove_eol(ptr);
        if (*ptr == 'v' && std::isspace(ptr[1])) {
            auto x = std::strtof(ptr + 1, &ptr);
            auto y = std::strtof(ptr, &ptr);
            auto z = std::strtof(ptr, &ptr);
            vertices.emplace_back(x, y, z);
        } else if (*ptr == 'f' && std::isspace(ptr[1])) {
            Vec<T, 3> points[2];
            ptr += 2;
            for (size_t i = 0; ; ++i) {
                if (auto index = read_index(&ptr)) {
                    size_t j = *index < 0 ? vertices.size() + *index : *index - 1;
                    assert(j < vertices.size());
                    auto v = vertices[j];
                    if (i >= 2) {
                        triangles.emplace_back(points[0], points[1], v);
                        points[1] = v;
                    } else {
                        points[i] = v;
                    }
                } else {
                    break;
                }
            }
        }
    }

    return triangles;
}